

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(RecyclableObject *prototype)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  if (prototype != (RecyclableObject *)0x0) {
    BVar4 = IsObjectOrNull(prototype);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2a30,"(JavascriptOperators::IsObjectOrNull(prototype))",
                                  "JavascriptOperators::IsObjectOrNull(prototype)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    while (TVar1 = ((prototype->type).ptr)->typeId, TVar1 != TypeIds_Null) {
      if (TVar1 == TypeIds_Proxy) {
        return true;
      }
      prototype = RecyclableObject::GetPrototype(prototype);
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(RecyclableObject* prototype)
    {
        if (prototype == nullptr)
        {
            return false;
        }

        Assert(JavascriptOperators::IsObjectOrNull(prototype));

        while (prototype->GetTypeId() != TypeIds_Null)
        {
            if (prototype->GetTypeId() == TypeIds_Proxy)
            {
                return true;
            }

            prototype = prototype->GetPrototype();
        }

        return false;
    }